

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O1

htab_hash_t proto_hash(MIR_item_t pi,void *arg)

{
  int *piVar1;
  node_t_conflict pnVar2;
  gen_ctx_conflict *pgVar3;
  VARR_MIR_var_t *pVVar4;
  VARR_MIR_type_t *pVVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  int iVar25;
  uint uVar26;
  MIR_type_t MVar27;
  int iVar28;
  MIR_type_t MVar29;
  ulong uVar30;
  ulong extraout_RAX;
  MIR_type_t *pMVar31;
  mir_size_t mVar32;
  int *piVar33;
  c2m_ctx_t pcVar34;
  MIR_var_t *pMVar35;
  ulong uVar36;
  ulong uVar37;
  char *suffix;
  uint8_t *v;
  ulong *puVar38;
  MIR_type_t promoted_type;
  ulong uVar39;
  type *ptVar40;
  type *ptVar41;
  MIR_proto_t pMVar42;
  c2m_ctx_t pcVar43;
  ulong uVar44;
  long lVar45;
  node_t_conflict pnVar46;
  char *pcVar47;
  size_t sVar48;
  int *piVar49;
  target_arg_info_t tStack_e0;
  gen_ctx_conflict *pgStack_d8;
  MIR_type_t aMStack_d0 [2];
  c2m_ctx_t pcStack_c8;
  bool bStack_89;
  
  pMVar42 = (pi->u).proto;
  ptVar40 = (type *)pMVar42->args;
  if (ptVar40 != (type *)0x0) {
    uVar36 = CONCAT44(0,pMVar42->nres);
    auVar6._8_8_ = 0;
    auVar6._0_8_ = uVar36;
    uVar30 = SUB168(auVar6 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar6 * ZEXT816(0x65862b62bdf5ef4d),0) ^ 0x2a;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar30;
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (long)pMVar42->vararg_p;
    uVar30 = SUB168(auVar8 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar8 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar30 ^
             SUB168(auVar7 * ZEXT816(0x288eea216831e6a7),8) +
             SUB168(auVar7 * ZEXT816(0x288eea216831e6a7),0);
    auVar9._8_8_ = 0;
    auVar9._0_8_ = uVar30;
    uVar30 = SUB168(auVar9 * ZEXT816(0x288eea216831e6a7),8) +
             SUB168(auVar9 * ZEXT816(0x288eea216831e6a7),0) ^ uVar30;
    if (uVar36 != 0) {
      uVar44 = 0;
      do {
        auVar6 = ZEXT416(pMVar42->res_types[uVar44]) * ZEXT816(0x65862b62bdf5ef4d);
        uVar30 = auVar6._8_8_ + auVar6._0_8_ ^ uVar30;
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar30;
        uVar30 = SUB168(auVar10 * ZEXT816(0x288eea216831e6a7),8) +
                 SUB168(auVar10 * ZEXT816(0x288eea216831e6a7),0) ^ uVar30;
        uVar44 = uVar44 + 1;
      } while (uVar36 != uVar44);
    }
    pnVar2 = ptVar40->pos_node;
    if (pnVar2 != (node_t_conflict)0x0) {
      lVar45 = *(long *)&ptVar40->antialias;
      pnVar46 = (node_t_conflict)0x0;
      do {
        uVar26 = *(uint *)(lVar45 + (long)pnVar46 * 0x18);
        auVar6 = ZEXT416(uVar26) * ZEXT816(0x65862b62bdf5ef4d);
        uVar30 = auVar6._8_8_ + auVar6._0_8_ ^ uVar30;
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar30;
        puVar38 = *(ulong **)(lVar45 + 8 + (long)pnVar46 * 0x18);
        uVar44 = strlen((char *)puVar38);
        uVar36 = uVar44 + 0x18;
        for (; 0xf < uVar44; uVar44 = uVar44 - 0x10) {
          auVar21._8_8_ = 0;
          auVar21._0_8_ = *puVar38;
          auVar22._8_8_ = 0;
          auVar22._0_8_ = puVar38[1];
          uVar36 = SUB168(ZEXT816(0x288eea216831e6a7) * auVar22,8) +
                   SUB168(ZEXT816(0x288eea216831e6a7) * auVar22,0) ^
                   SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar21,8) +
                   SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar21,0) ^ uVar36;
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar36;
          uVar36 = SUB168(auVar12 * ZEXT816(0x65862b62bdf5ef4d),8) +
                   SUB168(auVar12 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar36;
          puVar38 = puVar38 + 2;
        }
        if (7 < uVar44) {
          auVar23._8_8_ = 0;
          auVar23._0_8_ = *puVar38;
          uVar36 = uVar36 ^ SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar23,8) +
                            SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar23,0);
          uVar44 = uVar44 - 8;
          puVar38 = puVar38 + 1;
        }
        if (uVar44 != 0) {
          if (uVar44 == 8) {
            uVar37 = *puVar38;
          }
          else {
            if (uVar44 < 4) {
              uVar39 = 0;
              uVar37 = 0;
            }
            else {
              uVar37 = (ulong)(uint)*puVar38 << 0x20;
              uVar39 = 4;
            }
            if (uVar39 < uVar44) {
              do {
                uVar37 = uVar37 >> 8 | (ulong)*(byte *)((long)puVar38 + uVar39) << 0x38;
                uVar39 = uVar39 + 1;
              } while (uVar44 != uVar39);
            }
          }
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar37;
          uVar36 = uVar36 ^ SUB168(auVar13 * ZEXT816(0x288eea216831e6a7),8) +
                            SUB168(auVar13 * ZEXT816(0x288eea216831e6a7),0);
        }
        auVar14._8_8_ = 0;
        auVar14._0_8_ = uVar36;
        uVar36 = SUB168(auVar14 * ZEXT816(0x65862b62bdf5ef4d),8) +
                 SUB168(auVar14 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar36;
        auVar15._8_8_ = 0;
        auVar15._0_8_ = uVar36;
        auVar16._8_8_ = 0;
        auVar16._0_8_ =
             SUB168(auVar15 * ZEXT816(0x288eea216831e6a7),8) +
             SUB168(auVar15 * ZEXT816(0x288eea216831e6a7),0) ^ uVar36;
        uVar30 = SUB168(auVar11 * ZEXT816(0x288eea216831e6a7),8) +
                 SUB168(auVar11 * ZEXT816(0x288eea216831e6a7),0) ^ uVar30 ^
                 SUB168(auVar16 * ZEXT816(0x65862b62bdf5ef4d),8) +
                 SUB168(auVar16 * ZEXT816(0x65862b62bdf5ef4d),0);
        auVar17._8_8_ = 0;
        auVar17._0_8_ = uVar30;
        uVar30 = SUB168(auVar17 * ZEXT816(0x288eea216831e6a7),8) +
                 SUB168(auVar17 * ZEXT816(0x288eea216831e6a7),0) ^ uVar30;
        if (0xfffffff9 < uVar26 - 0x12) {
          auVar24._8_8_ = 0;
          auVar24._0_8_ = *(ulong *)(lVar45 + (long)pnVar46 * 0x18 + 0x10);
          uVar30 = SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar24,8) +
                   SUB168(ZEXT816(0x65862b62bdf5ef4d) * auVar24,0) ^ uVar30;
          auVar18._8_8_ = 0;
          auVar18._0_8_ = uVar30;
          uVar30 = SUB168(auVar18 * ZEXT816(0x288eea216831e6a7),8) +
                   SUB168(auVar18 * ZEXT816(0x288eea216831e6a7),0) ^ uVar30;
        }
        pnVar46 = (node_t_conflict)((long)&pnVar46->code + 1);
      } while (pnVar46 != pnVar2);
    }
    auVar19._8_8_ = 0;
    auVar19._0_8_ = uVar30;
    uVar30 = SUB168(auVar19 * ZEXT816(0x65862b62bdf5ef4d),8) +
             SUB168(auVar19 * ZEXT816(0x65862b62bdf5ef4d),0) ^ uVar30;
    auVar20._8_8_ = 0;
    auVar20._0_8_ = uVar30;
    return (uint)uVar30 ^
           SUB164(auVar20 * ZEXT816(0x288eea216831e6a7),8) +
           SUB164(auVar20 * ZEXT816(0x288eea216831e6a7),0);
  }
  proto_hash_cold_1();
  pcVar43 = *(c2m_ctx_t *)&pMVar42[1].vararg_p;
  ptVar41 = ptVar40[1].arr_type;
  iVar28 = *(int *)&pcVar43->options;
  if ((iVar28 != *(int *)&ptVar41->arr_type) ||
     ((char)pcVar43->env[0].__jmpbuf[1] != (char)ptVar41->mode)) {
    return 0;
  }
  puVar38 = (ulong *)pcVar43->env[0].__jmpbuf[2];
  if (puVar38 == (ulong *)0x0) {
    proto_eq_cold_2();
  }
  else {
    ptVar40 = *(type **)&ptVar41->align;
    if (ptVar40 != (type *)0x0) {
      pnVar2 = (node_t_conflict)*puVar38;
      if (pnVar2 != ptVar40->pos_node) {
        return 0;
      }
      if (iVar28 != 0) {
        lVar45 = 0;
        do {
          if (*(int *)(pcVar43->env[0].__jmpbuf[0] + lVar45 * 4) !=
              *(int *)(*(long *)&ptVar41->antialias + lVar45 * 4)) {
            return 0;
          }
          lVar45 = lVar45 + 1;
        } while (iVar28 != (int)lVar45);
      }
      bStack_89 = pnVar2 == (node_t_conflict)0x0;
      if (!bStack_89) {
        piVar49 = (int *)puVar38[2];
        piVar33 = *(int **)&ptVar40->antialias;
        iVar28 = *piVar49;
        if (iVar28 == *piVar33) {
          pnVar46 = (node_t_conflict)0x1;
          lVar45 = 0x18;
          do {
            iVar25 = strcmp(*(char **)((long)piVar49 + lVar45 + -0x10),
                            *(char **)((long)piVar33 + lVar45 + -0x10));
            if ((iVar25 != 0) ||
               (((0xfffffff9 < iVar28 - 0x12U &&
                 (*(long *)((long)piVar49 + lVar45 + -8) != *(long *)((long)piVar33 + lVar45 + -8)))
                || (bStack_89 = pnVar2 <= pnVar46, pnVar46 == pnVar2)))) break;
            iVar28 = *(int *)((long)piVar49 + lVar45);
            pnVar46 = (node_t_conflict)((long)&pnVar46->code + 1);
            piVar1 = (int *)((long)piVar33 + lVar45);
            lVar45 = lVar45 + 0x18;
          } while (iVar28 == *piVar1);
        }
      }
      return (uint)bStack_89;
    }
  }
  proto_eq_cold_1();
  pgVar3 = pcVar43->gen_ctx;
  pVVar4 = (pgVar3->proto_info).arg_vars;
  pgStack_d8 = pgVar3;
  if ((pVVar4 == (VARR_MIR_var_t *)0x0) || (pVVar4->varr == (MIR_var_t *)0x0)) {
LAB_0019ca19:
    collect_args_and_func_types_cold_6();
LAB_0019ca1e:
    collect_args_and_func_types_cold_5();
  }
  else {
    piVar49 = *(int **)(*(long *)&ptVar40->antialias + 0x20);
    pVVar4->els_num = 0;
    pVVar5 = (pgVar3->proto_info).ret_types;
    if ((pVVar5 == (VARR_MIR_type_t *)0x0) || (pVVar5->varr == (MIR_type_t *)0x0))
    goto LAB_0019ca1e;
    pVVar5->els_num = 0;
    (pgVar3->proto_info).res_ref_p = 0;
    tStack_e0.n_iregs = 0;
    tStack_e0.n_fregs = 0;
    set_type_layout(pcVar43,ptVar40->arr_type);
    ptVar40 = ptVar40->arr_type;
    pVVar5 = (pgVar3->proto_info).ret_types;
    pVVar4 = (pgVar3->proto_info).arg_vars;
    pcVar34 = pcVar43;
    pcStack_c8 = pcVar43;
    if ((ptVar40->mode == TM_BASIC) && (uVar30 = extraout_RAX, (ptVar40->u).basic_type == TP_VOID))
    {
LAB_0019c865:
      if ((piVar49 != (int *)0x0) &&
         (((*piVar49 != 0x7b ||
           (uVar30 = *(ulong *)(*(long *)(piVar49 + 2) + 0x18), *(int *)(uVar30 + 0x18) != 1)) ||
          (*(int *)(uVar30 + 0x30) != 1)))) {
        do {
          if (*piVar49 == 0x7b) {
            ptVar40 = *(type **)(*(long *)(piVar49 + 2) + 0x18);
            pcVar47 = "p";
          }
          else {
            piVar33 = *(int **)(piVar49 + 8);
            if (piVar33 != (int *)0x0) {
              piVar33 = *(int **)(piVar33 + 6);
            }
            if (((*piVar49 != 0x55) || (piVar33 == (int *)0x0)) || (*piVar33 != 0x5d))
            goto LAB_0019c9f5;
            ptVar40 = *(type **)(*(long *)(piVar49 + 2) + 0x40);
            pcVar47 = get_param_name(pcVar34,ptVar40,*(char **)(*(long *)(piVar33 + 8) + 0x20));
          }
          pVVar4 = (pgStack_d8->proto_info).arg_vars;
          iVar28 = process_aggregate_arg(pcVar34,ptVar40,&tStack_e0,aMStack_d0);
          if ((ptVar40->mode & ~TM_BASIC) == TM_STRUCT) {
            MVar29 = get_blk_type(iVar28,aMStack_d0);
            pcVar34 = (c2m_ctx_t)raw_type_size(pcVar34,ptVar40);
            uVar30 = (ulong)ptVar40->align;
            if (uVar30 != 0) {
              uVar36 = (long)pcVar34->env[0].__jmpbuf + (uVar30 - 0x11);
              pcVar34 = (c2m_ctx_t)(uVar36 - uVar36 % uVar30);
            }
          }
          else {
            MVar29 = get_mir_type(pcVar34,ptVar40);
            if ((MVar29 & 0x1e) == MIR_T_F) {
              tStack_e0.n_fregs = tStack_e0.n_fregs + 1;
            }
            else if (MVar29 != MIR_T_LD) {
              tStack_e0.n_iregs = tStack_e0.n_iregs + 1;
            }
          }
          if (pVVar4->varr == (MIR_var_t *)0x0) {
            collect_args_and_func_types_cold_4();
LAB_0019c9f5:
            __assert_fail("p->code == N_SPEC_DECL && declarator != NULL && declarator->code == N_DECL"
                          ,
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/c2mir/c2mir.c"
                          ,0x2c94,"void collect_args_and_func_types(c2m_ctx_t, struct func_type *)")
            ;
          }
          uVar30 = pVVar4->els_num + 1;
          if (pVVar4->size < uVar30) {
            sVar48 = (uVar30 >> 1) + uVar30;
            pMVar35 = (MIR_var_t *)realloc(pVVar4->varr,sVar48 * 0x18);
            pVVar4->varr = pMVar35;
            pVVar4->size = sVar48;
          }
          sVar48 = pVVar4->els_num;
          pMVar35 = pVVar4->varr;
          uVar30 = sVar48 * 3;
          pVVar4->els_num = sVar48 + 1;
          pMVar35[sVar48].type = MVar29;
          pMVar35[sVar48].name = pcVar47;
          pMVar35[sVar48].size = (size_t)pcVar34;
          piVar49 = *(int **)(piVar49 + 6);
          pcVar34 = pcStack_c8;
        } while (piVar49 != (int *)0x0);
      }
      return (htab_hash_t)uVar30;
    }
    uVar26 = process_ret_type(pcVar43,ptVar40,aMStack_d0);
    uVar30 = (ulong)uVar26;
    if (uVar26 != 0) {
      if (0 < (int)uVar26) {
        uVar36 = 0;
        do {
          ptVar40 = (type *)0x5;
          MVar29 = aMStack_d0[uVar36];
          MVar27 = MVar29 & ~MIR_T_I16;
          if (MVar27 == MIR_T_U8) {
            MVar29 = MIR_T_U32;
          }
          if (MVar27 == MIR_T_I8) {
            MVar29 = MIR_T_I32;
          }
          pcVar43 = (c2m_ctx_t)pVVar5->varr;
          if (pcVar43 == (c2m_ctx_t)0x0) {
            collect_args_and_func_types_cold_1();
            goto LAB_0019ca19;
          }
          uVar30 = pVVar5->els_num + 1;
          if (pVVar5->size < uVar30) {
            sVar48 = (uVar30 >> 1) + uVar30;
            pMVar31 = (MIR_type_t *)realloc(pcVar43,sVar48 * 4);
            pVVar5->varr = pMVar31;
            pVVar5->size = sVar48;
            pcVar34 = pcStack_c8;
          }
          uVar30 = pVVar5->els_num;
          pVVar5->els_num = uVar30 + 1;
          pVVar5->varr[uVar30] = MVar29;
          uVar36 = uVar36 + 1;
        } while (uVar26 != uVar36);
      }
      goto LAB_0019c865;
    }
    if ((ptVar40->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar29 = get_mir_type(pcVar43,ptVar40);
      pcVar43 = (c2m_ctx_t)pVVar5->varr;
      if (pcVar43 != (c2m_ctx_t)0x0) {
        uVar30 = pVVar5->els_num + 1;
        if (pVVar5->size < uVar30) {
          sVar48 = (uVar30 >> 1) + uVar30;
          pMVar31 = (MIR_type_t *)realloc(pcVar43,sVar48 * 4);
          pVVar5->varr = pMVar31;
          pVVar5->size = sVar48;
        }
        uVar30 = pVVar5->els_num;
        pVVar5->els_num = uVar30 + 1;
        pVVar5->varr[uVar30] = MVar29;
        goto LAB_0019c865;
      }
      goto LAB_0019ca28;
    }
    ptVar41 = ptVar40;
    mVar32 = raw_type_size(pcVar43,ptVar40);
    uVar30 = (ulong)ptVar40->align;
    if (uVar30 != 0) {
      uVar36 = (mVar32 - 1) + uVar30;
      mVar32 = uVar36 - uVar36 % uVar30;
    }
    pcVar43 = (c2m_ctx_t)pVVar4->varr;
    ptVar40 = ptVar41;
    if (pcVar43 != (c2m_ctx_t)0x0) {
      uVar30 = pVVar4->els_num + 1;
      if (pVVar4->size < uVar30) {
        sVar48 = (uVar30 >> 1) + uVar30;
        pMVar35 = (MIR_var_t *)realloc(pcVar43,sVar48 * 0x18);
        pVVar4->varr = pMVar35;
        pVVar4->size = sVar48;
      }
      sVar48 = pVVar4->els_num;
      pMVar35 = pVVar4->varr;
      uVar30 = sVar48 * 3;
      pVVar4->els_num = sVar48 + 1;
      pMVar35[sVar48].type = MIR_T_RBLK;
      pMVar35[sVar48].name = "Ret_Addr";
      pMVar35[sVar48].size = mVar32;
      tStack_e0.n_iregs = 1;
      goto LAB_0019c865;
    }
  }
  collect_args_and_func_types_cold_3();
LAB_0019ca28:
  collect_args_and_func_types_cold_2();
  if (pcVar43 != (c2m_ctx_t)0x0) {
    return (htab_hash_t)pcVar43->env[0].__jmpbuf[0];
  }
  VARR_MIR_var_taddr_cold_1();
  if (pcVar43 == (c2m_ctx_t)0x0) {
    VARR_MIR_var_tlength_cold_1();
    MVar29 = MIR_T_I64;
    if ((ptVar40->mode & ~TM_BASIC) != TM_STRUCT) {
      MVar29 = get_mir_type(pcVar43,ptVar40);
    }
    MVar27 = MIR_T_U32;
    if ((MVar29 & 0x1d) != MIR_T_U8) {
      MVar27 = MVar29;
    }
    promoted_type = MIR_T_I32;
    if ((MVar29 & 0x1d) != MIR_T_I8) {
      promoted_type = MVar27;
    }
    pcVar47 = get_reg_var_name(pcVar43,promoted_type,suffix,0);
    return (htab_hash_t)pcVar47;
  }
  return (htab_hash_t)pcVar43->ctx;
}

Assistant:

static htab_hash_t proto_hash (MIR_item_t pi, void *arg MIR_UNUSED) {
  MIR_proto_t p = pi->u.proto;
  MIR_var_t *args = VARR_ADDR (MIR_var_t, p->args);
  uint64_t h = mir_hash_init (42);

  h = mir_hash_step (h, p->nres);
  h = mir_hash_step (h, p->vararg_p);
  for (uint32_t i = 0; i < p->nres; i++) h = mir_hash_step (h, p->res_types[i]);
  for (size_t i = 0; i < VARR_LENGTH (MIR_var_t, p->args); i++) {
    h = mir_hash_step (h, args[i].type);
    h = mir_hash_step (h, mir_hash (args[i].name, strlen (args[i].name), 24));
    if (MIR_all_blk_type_p (args[i].type)) h = mir_hash_step (h, args[i].size);
  }
  return (htab_hash_t) mir_hash_finish (h);
}